

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QObject*,int>::emplace<int_const&>(QHash<QObject*,int> *this,QObject **key,int *args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<QObject_*,_int>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<QObject_*,_int> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_002c86cc:
    pDVar2 = *(Data<QHashPrivate::Node<QObject_*,_int>_> **)this;
    local_28.d = pDVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<QObject_*,_int>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QObject_*,_int>_>::detached(pDVar2);
      *(Data<QHashPrivate::Node<QObject_*,_int>_> **)this = pDVar2;
    }
    pVar3 = (piter)emplace_helper<int_const&>(this,key,args);
    QHash<QObject_*,_int>::~QHash(&local_28);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      if ((pDVar1 != (Data *)0x0) &&
         ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_002c86cc;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<int_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_002c8761;
    }
    local_28.d._0_4_ = *args;
    pVar3 = (piter)QHash<QObject_*,_int>::emplace_helper<int>
                             ((QHash<QObject_*,_int> *)this,key,(int *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_002c8761:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }